

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * __thiscall
units::probeUnit_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  pointer pcVar1;
  unit_data uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *extraout_RAX;
  string *psVar4;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  precise_unit pVar8;
  __string_type __str_1;
  string fnd;
  __string_type __str;
  unit in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  double local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  double local_58;
  undefined8 local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_e0 = *(double *)this * un->multiplier_;
  uVar2 = detail::unit_data::operator*((unit_data *)(this + 8),&un->base_units_);
  local_50 = CONCAT44(un->commodity_ | *(uint *)(this + 0xc),uVar2);
  local_58 = local_e0;
  find_unit_abi_cxx11_(in_stack_fffffffffffffef8);
  if (local_b8._8_8_ == 0) {
    detail::unit_data::inv((unit_data *)&local_50);
    find_unit_abi_cxx11_(in_stack_fffffffffffffef8);
    probeUnit_abi_cxx11_();
    if ((extraout_RAX_00 & 1) == 0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/(","");
      pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_48,(char *)local_b8._0_8_,local_b8._8_8_);
      local_98._M_allocated_capacity = (size_type)(pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_allocated_capacity == paVar5) {
        local_88._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_88._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_98._M_allocated_capacity = (size_type)&local_88;
      }
      else {
        local_88._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_98._8_8_ = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_98,local_98._8_8_,0,1,'*');
      local_d8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == paVar5) {
        local_d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_d8._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_d8,(char *)un[1].multiplier_);
      local_100._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == paVar5) {
        local_100.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_100._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_replace_aux(&local_100,local_100._M_string_length,0,1,')');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 == paVar5) {
        uVar7 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_allocated_capacity != &local_88) {
        operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
      }
      uVar7 = local_48._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_003f2c77;
    }
    else {
      pVar8 = precise_unit::operator/((precise_unit *)this,un);
      local_50 = pVar8._8_8_;
      local_58 = pVar8.multiplier_;
      find_unit_abi_cxx11_(in_stack_fffffffffffffef8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                &local_100);
      paVar5 = &local_100.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar5) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_b8._8_8_ == 0) {
        local_e0 = local_58;
        detail::unit_data::inv((unit_data *)&local_50);
        find_unit_abi_cxx11_(in_stack_fffffffffffffef8);
        probeUnit_abi_cxx11_();
        if ((extraout_RAX_01 & 1) == 0) goto LAB_003f2c77;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_98._M_local_buf,(char *)un[1].multiplier_,
                   (allocator<char> *)&local_48);
        pbVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_98,local_98._8_8_,0,1,'/');
        local_d8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
        paVar5 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p == paVar5) {
          local_d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_d8._M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        pbVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_d8,(char *)local_b8._0_8_,local_b8._8_8_);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (pbVar3->_M_dataplus)._M_p;
        paVar5 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 == paVar5) {
          uVar7 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        local_48.field_2._M_allocated_capacity = local_88._M_allocated_capacity;
        uVar7 = local_98._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_allocated_capacity == &local_88) goto LAB_003f2c77;
      }
      else {
        local_100._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_b8._0_8_,(pointer)(local_b8._0_8_ + local_b8._8_8_));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux(&local_100,local_100._M_string_length,0,1,'*');
        pbVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                           (&local_100,(char *)un[1].multiplier_);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (pbVar3->_M_dataplus)._M_p;
        paVar6 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 == paVar6) {
          uVar7 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        local_48.field_2._M_allocated_capacity = local_100.field_2._M_allocated_capacity;
        uVar7 = local_100._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == paVar5) goto LAB_003f2c77;
      }
    }
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8._0_8_,(pointer)(local_b8._0_8_ + local_b8._8_8_));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_replace_aux(&local_78,local_78._M_string_length,0,1,'/');
    pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_78,(char *)un[1].multiplier_);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar5) {
      uVar7 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    local_48.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
    uVar7 = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_003f2c77;
  }
  operator_delete((void *)uVar7,local_48.field_2._M_allocated_capacity + 1);
LAB_003f2c77:
  psVar4 = (string *)(local_b8 + 0x10);
  if ((string *)local_b8._0_8_ != psVar4) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

static std::string probeUnit(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    // let's try common divisor units
    auto ext = un * probe.first;
    auto fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '/' + probe.second;
    }
    // let's try inverse of common multiplier units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string("1/(") + fnd + '*' + probe.second + ')';
    }

    // let's try common multiplier units
    ext = un / probe.first;
    fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '*' + probe.second;
    }
    // let's try common divisor with inv units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string(probe.second) + '/' + fnd;
    }
    return std::string{};
}